

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffgnxk(fitsfile *fptr,char **inclist,int ninc,char **exclist,int nexc,char *card,int *status)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int namelen;
  int exact;
  char keybuf [81];
  char keyname [75];
  int local_11c;
  int local_118;
  int local_114;
  char *local_110;
  long local_108;
  fitsfile *local_100;
  char **local_f8;
  int local_ec;
  char local_e8 [96];
  char local_88 [88];
  
  *card = '\0';
  iVar1 = *status;
  if (iVar1 < 1) {
    local_118 = ninc;
    local_100 = fptr;
    local_f8 = inclist;
    iVar1 = ffgcrd(fptr,"*",local_e8,status);
    if (iVar1 < 1) {
      local_108 = (long)local_118;
      if (nexc < 1) {
        nexc = 0;
      }
      local_110 = card;
      do {
        ffgknm(local_e8,local_88,&local_114,status);
        if (0 < local_118) {
          lVar2 = 0;
          do {
            ffcmps(local_f8[lVar2],local_88,0,&local_11c,&local_ec);
            if (local_11c != 0) {
              uVar3 = 0;
              do {
                if ((uint)nexc == uVar3) {
                  strcat(local_110,local_e8);
                  goto LAB_001691b1;
                }
                ffcmps(exclist[uVar3],local_88,0,&local_11c,&local_ec);
                uVar3 = uVar3 + 1;
              } while (local_11c == 0);
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 != local_108);
        }
        iVar1 = ffgcrd(local_100,"*",local_e8,status);
      } while (iVar1 < 1);
    }
LAB_001691b1:
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgnxk( fitsfile *fptr,     /* I - FITS file pointer              */
            char **inclist,     /* I - list of included keyword names */
            int ninc,           /* I - number of names in inclist     */
            char **exclist,     /* I - list of excluded keyword names */
            int nexc,           /* I - number of names in exclist     */
            char *card,         /* O - first matching keyword         */
            int  *status)       /* IO - error status                  */
/*
    Return the next keyword that matches one of the names in inclist
    but does not match any of the names in exclist.  The search
    goes from the current position to the end of the header, only.
    Wild card characters may be used in the name lists ('*', '?' and '#').
*/
{
    int casesn, match, exact, namelen;
    long ii, jj;
    char keybuf[FLEN_CARD], keyname[FLEN_KEYWORD];

    card[0] = '\0';
    if (*status > 0)
        return(*status);

    casesn = FALSE;

    /* get next card, and return with an error if hit end of header */
    while( ffgcrd(fptr, "*", keybuf, status) <= 0)
    {
        ffgknm(keybuf, keyname, &namelen, status); /* get the keyword name */
        
        /* does keyword match any names in the include list? */
        for (ii = 0; ii < ninc; ii++)
        {
            ffcmps(inclist[ii], keyname, casesn, &match, &exact);
            if (match)
            {
                /* does keyword match any names in the exclusion list? */
                jj = -1;
                while ( ++jj < nexc )
                {
                    ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                    if (match)
                        break;
                }

                if (jj >= nexc)
                {
                    /* not in exclusion list, so return this keyword */
                    strcat(card, keybuf);
                    return(*status);
                }
            }
        }
    }
    return(*status);
}